

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,vector<double,_std::allocator<double>_> *v)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  allocator local_c1;
  string local_c0 [32];
  ulong local_a0;
  size_t i;
  char buf [128];
  vector<double,_std::allocator<double>_> *v_local;
  ostream *ofs_local;
  
  buf._120_8_ = v;
  std::operator<<(ofs,"[");
  local_a0 = 0;
  while( true ) {
    uVar1 = local_a0;
    sVar2 = vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)buf._120_8_);
    if (sVar2 <= uVar1) break;
    if (local_a0 != 0) {
      std::operator<<(ofs,", ");
    }
    pvVar3 = vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)buf._120_8_,local_a0);
    dtoa_milo(*pvVar3,(char *)&i);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,(char *)&i,&local_c1);
    std::operator<<(ofs,local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    local_a0 = local_a0 + 1;
  }
  std::operator<<(ofs,"]");
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const std::vector<double> &v) {
  // Not sure what is the HARD-LIMT buffer length for dtoa_milo,
  // but according to std::numeric_limits<double>::digits10(=15),
  // 32 should be sufficient, but allocate 128 just in case
  char buf[128];

  // TODO: multi-threading for further performance gain?

  ofs << "[";
  for (size_t i = 0; i < v.size(); i++) {
    if (i > 0) {
      ofs << ", ";
    }
    dtoa_milo(v[i], buf);
    ofs << std::string(buf);
  }
  ofs << "]";

  return ofs;
}